

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

void __thiscall QLibraryPrivate::~QLibraryPrivate(QLibraryPrivate *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->qualifiedFileName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->errorString).d);
  QCborValue::~QCborValue((QCborValue *)&this->metaData);
  QWeakPointer<QObject>::~QWeakPointer(&(this->inst).wp);
  QMutex::~QMutex(&this->mutex);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->fullVersion).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

QLibraryPrivate::~QLibraryPrivate()
{
}